

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte type1;
  ushort key;
  byte type2_00;
  roaring_array_t *prVar1;
  uint uVar2;
  _Bool _Var3;
  int iVar4;
  shared_container_t *psVar5;
  container_t *c;
  ushort *puVar6;
  bitset_container_t *src_2;
  shared_container_t *container;
  ushort uVar7;
  uint8_t uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bitset_container_t *bc;
  uint8_t result_type;
  uint8_t type2;
  byte local_51;
  uint local_50;
  uint local_4c;
  roaring_array_t *local_48;
  bitset_container_t *local_40;
  container_t *local_38;
  uint i;
  
  if (x1 == x2) {
    __assert_fail("x1 != x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x43cb,
                  "void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *, const roaring_bitmap_t *)"
                 );
  }
  result_type = '\0';
  local_4c = (x2->high_low_container).size;
  if (local_4c == 0) {
    return;
  }
  uVar10 = (x1->high_low_container).size;
  if (uVar10 == 0) {
    roaring_bitmap_overwrite(x1,x2);
    return;
  }
  uVar7 = *(x1->high_low_container).keys;
  puVar6 = (x2->high_low_container).keys;
  uVar11 = 0;
  i = 0;
  local_48 = &x2->high_low_container;
LAB_00111044:
  do {
    prVar1 = local_48;
    key = *puVar6;
    while( true ) {
      uVar9 = i + 1;
      if (uVar7 == key) break;
      if (key <= uVar7) {
        type2 = local_48->typecodes[uVar11 & 0xffff];
        local_50 = uVar11;
        c = get_copy_of_container
                      (local_48->containers[uVar11 & 0xffff],&type2,(_Bool)(local_48->flags & 1));
        uVar11 = local_50;
        uVar8 = type2;
        if ((prVar1->flags & 1) != 0) {
          local_40 = (bitset_container_t *)CONCAT44(local_40._4_4_,(uint)type2);
          local_38 = c;
          ra_set_container_at_index(local_48,local_50,c,type2);
          uVar8 = (uint8_t)local_40;
          c = local_38;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,i,key,c,uVar8);
        uVar10 = uVar10 + 1;
        uVar11 = uVar11 + 1;
        uVar2 = local_4c;
        if (uVar11 == local_4c) goto LAB_00111287;
        puVar6 = (ushort *)((ulong)((uVar11 & 0xffff) * 2) + (long)local_48->keys);
        i = uVar9;
        goto LAB_00111044;
      }
      if (uVar10 == uVar9) goto LAB_0011128c;
      uVar7 = (x1->high_low_container).keys[uVar9 & 0xffff];
      i = uVar9;
    }
    type1 = (x1->high_low_container).typecodes[i & 0xffff];
    container = (shared_container_t *)(x1->high_low_container).containers[i & 0xffff];
    type2 = local_48->typecodes[uVar11 & 0xffff];
    if (type1 == 4) {
      local_50 = uVar11;
      psVar5 = (shared_container_t *)
               container_lazy_xor(container,'\x04',local_48->containers[uVar11 & 0xffff],type2,
                                  &result_type);
      shared_container_free(container);
      container = psVar5;
    }
    else {
      local_38 = (container_t *)CONCAT44(local_38._4_4_,i);
      local_51 = type2;
      local_50 = uVar11;
      src_2 = (bitset_container_t *)
              container_unwrap_shared(local_48->containers[uVar11 & 0xffff],&local_51);
      type2_00 = local_51;
      if ((uint)local_51 + (uint)type1 * 4 == 5) {
        bitset_container_xor_nocard
                  ((bitset_container_t *)container,src_2,(bitset_container_t *)container);
        result_type = '\x01';
      }
      else {
        if ((type1 == 1) && (*(int *)&container->container == -1)) {
          local_40 = src_2;
          iVar4 = bitset_container_compute_cardinality((bitset_container_t *)container);
          *(int *)&container->container = iVar4;
          src_2 = local_40;
        }
        container = (shared_container_t *)
                    container_ixor(container,type1,src_2,type2_00,&result_type);
      }
      i = (uint)local_38;
    }
    uVar8 = result_type;
    _Var3 = container_nonzero_cardinality(container,result_type);
    if (_Var3) {
      ra_set_container_at_index(&x1->high_low_container,i,container,uVar8);
      i = uVar9;
    }
    else {
      container_free(container,uVar8);
      ra_remove_at_index(&x1->high_low_container,i);
      uVar10 = uVar10 - 1;
    }
    uVar11 = local_50 + 1;
    uVar9 = i;
    uVar2 = uVar11;
    if ((i == uVar10) || (uVar11 == local_4c)) {
LAB_00111287:
      uVar11 = uVar2;
      if (uVar9 != uVar10) {
        return;
      }
LAB_0011128c:
      ra_append_copy_range
                (&x1->high_low_container,local_48,uVar11,local_4c,(_Bool)(local_48->flags & 1));
      return;
    }
    uVar7 = (x1->high_low_container).keys[i & 0xffff];
    puVar6 = (ushort *)((ulong)((uVar11 & 0xffff) * 2) + (long)local_48->keys);
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_lazy_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            }
            else {
                c = container_lazy_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}